

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O0

Maybe<kj::StringTree> * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeBrandDepInitializer
          (Maybe<kj::StringTree> *__return_storage_ptr__,CapnpcCppMain *this,Schema type,
          CppTypeName *name)

{
  bool bVar1;
  CppTypeName *params_1;
  StringTree local_80;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  CppTypeName *local_28;
  CppTypeName *name_local;
  CapnpcCppMain *this_local;
  Schema type_local;
  
  params_1 = name;
  local_28 = name;
  name_local = (CppTypeName *)this;
  this_local = (CapnpcCppMain *)type.raw;
  type_local.raw = (RawBrandedSchema *)__return_storage_ptr__;
  bVar1 = Schema::isBranded((Schema *)&this_local);
  if (bVar1) {
    kj::StringPtr::StringPtr((StringPtr *)&local_38,"_capnpPrivate");
    CppTypeName::addMemberType(name,(StringPtr)local_38);
    kj::StringPtr::StringPtr((StringPtr *)&local_48,"brand");
    CppTypeName::addMemberValue(name,(StringPtr)local_48);
    kj::strTree<capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[3]>
              (&local_80,(kj *)name,(CppTypeName *)0x4228f7,(char (*) [3])params_1);
    kj::Maybe<kj::StringTree>::Maybe(__return_storage_ptr__,&local_80);
    kj::StringTree::~StringTree(&local_80);
  }
  else {
    kj::Maybe<kj::StringTree>::Maybe(__return_storage_ptr__,(void *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::StringTree> makeBrandDepInitializer(Schema type, CppTypeName name) {
    if (type.isBranded()) {
      name.addMemberType("_capnpPrivate");
      name.addMemberValue("brand");
      return kj::strTree(name, "()");
    } else {
      return nullptr;
    }
  }